

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Precedence binop_prec(Tk binop)

{
  Tk binop_local;
  
  if (binop != 0x2a) {
    if ((binop == 0x2b) || (binop == 0x2d)) {
      return PREC_ADD;
    }
    if (binop != 0x2f) {
      if ((binop != 0x3c) && (binop != 0x3e)) {
        if (binop == 0x100) {
          return PREC_CONCAT;
        }
        if (binop - 0x106U < 2) {
          return PREC_EQ;
        }
        if (1 < binop - 0x108U) {
          if (binop == 0x10a) {
            return PREC_AND;
          }
          if (binop == 0x10b) {
            return PREC_OR;
          }
          return PREC_NOT_FOUND;
        }
      }
      return PREC_ORD;
    }
  }
  return PREC_MUL;
}

Assistant:

static Precedence binop_prec(Tk binop) {
	switch (binop) {
	case TK_OR:
		return PREC_OR;
	case TK_AND:
		return PREC_AND;
	case TK_EQ: case TK_NEQ:
		return PREC_EQ;
	case '>': case '<': case TK_GE: case TK_LE:
		return PREC_ORD;
	case TK_CONCAT:
		return PREC_CONCAT;
	case '+': case '-':
		return PREC_ADD;
	case '*': case '/':
		return PREC_MUL;
	default:
		return PREC_NOT_FOUND;
	}
}